

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_text.cpp
# Opt level: O3

void __thiscall
GameText::GameText(GameText *this,string *text,string *name,uint8_t lines_in_textbox)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  byte bVar3;
  string *__range1;
  uint16_t uVar4;
  size_type sVar5;
  string full_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = &(this->_initial_text).field_2;
  (this->_initial_text)._M_dataplus._M_p = (pointer)local_60;
  (this->_initial_text)._M_string_length = 0;
  (this->_initial_text).field_2._M_local_buf[0] = '\0';
  local_68 = &(this->_output_text).field_2;
  (this->_output_text)._M_dataplus._M_p = (pointer)local_68;
  (this->_output_text)._M_string_length = 0;
  (this->_output_text).field_2._M_local_buf[0] = '\0';
  this->_current_line_length = 0;
  this->_current_line_count = '\0';
  this->_lines_in_textbox = lines_in_textbox;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + name->_M_string_length);
  local_58 = text;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_88,": ");
  _Var2._M_p = local_88._M_dataplus._M_p;
  if (local_88._M_string_length != 0) {
    uVar4 = this->_current_line_length;
    sVar5 = 0;
    do {
      bVar3 = character_width(_Var2._M_p[sVar5]);
      uVar4 = uVar4 + bVar3;
      this->_current_line_length = uVar4;
      sVar5 = sVar5 + 1;
    } while (local_88._M_string_length != sVar5);
  }
  if (name->_M_string_length == 0) {
    GameText::text(this,local_58);
  }
  else {
    std::operator+(&local_50,"\x1c",local_58);
    GameText::text(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

GameText::GameText(const std::string& text, const std::string& name, uint8_t lines_in_textbox) :
    _lines_in_textbox(lines_in_textbox)
{
    std::string full_name = name + ": ";
    for(char c : full_name)
        _current_line_length += character_width(c);

    if(!name.empty())
        this->text("\u001c" + text);
    else
        this->text(text);
}